

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O3

iterator __thiscall FIX::FieldMap::findPositionFor(FieldMap *this,int tag)

{
  bool bVar1;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  int local_24;
  
  _Var2._M_current =
       (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_start != _Var2._M_current) {
    bVar1 = message_order::operator()(&this->m_order,_Var2._M_current[-1].m_tag,tag);
    if ((bVar1) || (_Var2._M_current[-1].m_tag == tag)) {
      _Var2._M_current =
           (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      _Var2 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<FIX::FieldBase*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>,int,__gnu_cxx::__ops::_Val_comp_iter<FIX::FieldMap::sorter>>
                        ((this->m_fields).
                         super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl
                         .super__Vector_impl_data._M_start,
                         (this->m_fields).
                         super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl
                         .super__Vector_impl_data._M_finish,&local_24,
                         (_Val_comp_iter<FIX::FieldMap::sorter>)&this->m_order);
    }
  }
  return (iterator)_Var2._M_current;
}

Assistant:

Fields::iterator findPositionFor(int tag) {
    if (m_fields.empty()) {
      return m_fields.end();
    }

    const FieldBase &lastField = m_fields.back();
    if (m_order(lastField.getTag(), tag) || lastField.getTag() == tag) {
      return m_fields.end();
    }

    return std::upper_bound(m_fields.begin(), m_fields.end(), tag, sorter(m_order));
  }